

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Select * sqlite3ExprListToValues(Parse *pParse,int nElem,ExprList *pEList)

{
  byte *pbVar1;
  Expr *pEVar2;
  Select *pSVar3;
  Select *pSVar4;
  char *pcVar5;
  ulong uVar6;
  Select *pSVar7;
  ExprList_item *pEVar8;
  long lVar9;
  
  if (0 < pEList->nExpr) {
    pEVar8 = pEList->a;
    lVar9 = 0;
    pSVar7 = (Select *)0x0;
    do {
      pEVar2 = pEVar8->pExpr;
      uVar6 = 1;
      if (pEVar2->op == 0xb1) {
        uVar6 = (ulong)(uint)((pEVar2->x).pList)->nExpr;
      }
      if ((int)uVar6 != nElem) {
        pcVar5 = "";
        if (1 < (int)uVar6) {
          pcVar5 = "s";
        }
        sqlite3ErrorMsg(pParse,"IN(...) element has %d term%s - expected %d",uVar6,pcVar5,
                        (ulong)(uint)nElem);
        break;
      }
      pSVar4 = sqlite3SelectNew(pParse,(pEVar2->x).pList,(SrcList *)0x0,(Expr *)0x0,(ExprList *)0x0,
                                (Expr *)0x0,(ExprList *)0x0,0x200,(Expr *)0x0);
      (pEVar2->x).pList = (ExprList *)0x0;
      pSVar3 = pSVar7;
      if ((pSVar4 != (Select *)0x0) && (pSVar3 = pSVar4, pSVar7 != (Select *)0x0)) {
        pSVar4->op = 0x87;
        pSVar4->pPrior = pSVar7;
      }
      pSVar7 = pSVar3;
      lVar9 = lVar9 + 1;
      pEVar8 = pEVar8 + 1;
    } while (lVar9 < pEList->nExpr);
    if (pSVar7 != (Select *)0x0) {
      if (pSVar7->pPrior != (Select *)0x0) {
        pbVar1 = (byte *)((long)&pSVar7->selFlags + 1);
        *pbVar1 = *pbVar1 | 4;
      }
      goto LAB_001639b7;
    }
  }
  pSVar7 = (Select *)0x0;
LAB_001639b7:
  exprListDeleteNN(pParse->db,pEList);
  return pSVar7;
}

Assistant:

SQLITE_PRIVATE Select *sqlite3ExprListToValues(Parse *pParse, int nElem, ExprList *pEList){
  int ii;
  Select *pRet = 0;
  assert( nElem>1 );
  for(ii=0; ii<pEList->nExpr; ii++){
    Select *pSel;
    Expr *pExpr = pEList->a[ii].pExpr;
    int nExprElem;
    if( pExpr->op==TK_VECTOR ){
      assert( ExprUseXList(pExpr) );
      nExprElem = pExpr->x.pList->nExpr;
    }else{
      nExprElem = 1;
    }
    if( nExprElem!=nElem ){
      sqlite3ErrorMsg(pParse, "IN(...) element has %d term%s - expected %d",
          nExprElem, nExprElem>1?"s":"", nElem
      );
      break;
    }
    assert( ExprUseXList(pExpr) );
    pSel = sqlite3SelectNew(pParse, pExpr->x.pList, 0, 0, 0, 0, 0, SF_Values,0);
    pExpr->x.pList = 0;
    if( pSel ){
      if( pRet ){
        pSel->op = TK_ALL;
        pSel->pPrior = pRet;
      }
      pRet = pSel;
    }
  }

  if( pRet && pRet->pPrior ){
    pRet->selFlags |= SF_MultiValue;
  }
  sqlite3ExprListDelete(pParse->db, pEList);
  return pRet;
}